

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_schema.c
# Opt level: O3

void tnt_schema_sval_free(tnt_schema_sval *val)

{
  uint uVar1;
  mh_assoc_t *h;
  undefined8 *ptr;
  mh_int_t *pmVar2;
  void *key;
  ulong uVar3;
  uint32_t uVar4;
  int iVar5;
  sbyte sVar6;
  uint uVar7;
  mh_int_t x;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  assoc_val *local_48;
  assoc_val *local_40;
  
  if (val != (tnt_schema_sval *)0x0) {
    tnt_mem_free(val->name);
    h = val->index;
    if (h != (mh_assoc_t *)0x0) {
      uVar1 = h->n_buckets;
      if (uVar1 == 0) {
        uVar10 = 0;
LAB_00110d54:
        if (uVar10 < uVar1) {
          do {
            ptr = (undefined8 *)h->p[uVar10]->data;
            uVar4 = PMurHash32(0xd,(int *)((long)ptr + 0xc),4);
            uVar1 = h->n_buckets;
            uVar9 = (ulong)uVar4 % (ulong)uVar1;
            pmVar2 = h->b;
            while( true ) {
              x = (mh_int_t)uVar9;
              uVar3 = uVar9 >> 4;
              uVar7 = pmVar2[uVar3];
              sVar6 = (sbyte)(x & 0xf);
              if ((((uVar7 >> (x & 0xf) & 1) != 0) &&
                  (local_40 = h->p[uVar9], (local_40->key).id_len == 4)) &&
                 (*(int *)((long)ptr + 0xc) == *(int *)(local_40->key).id)) {
                if (x != uVar1) {
                  pmVar2[uVar3] = uVar7 & ~(1 << sVar6);
                  h->size = h->size - 1;
                  if (((pmVar2[uVar3] >> sVar6) >> 0x10 & 1) == 0) {
                    h->n_dirty = h->n_dirty - 1;
                  }
                  if (h->resize_position != 0) {
                    mh_assoc_del_resize(h,x,(void *)0x0);
                  }
                  goto LAB_00110e20;
                }
                break;
              }
              if (((uVar7 >> sVar6) >> 0x10 & 1) == 0) break;
              uVar8 = x + uVar4 % (uVar1 - 1) + 1;
              uVar7 = uVar1;
              if (uVar8 < uVar1) {
                uVar7 = 0;
              }
              uVar9 = (ulong)(uVar8 - uVar7);
            }
            local_40 = (assoc_val *)0x0;
LAB_00110e20:
            key = (void *)*ptr;
            uVar1 = *(uint *)(ptr + 1);
            uVar4 = PMurHash32(0xd,key,uVar1);
            uVar7 = h->n_buckets;
            uVar9 = (ulong)uVar4 % (ulong)uVar7;
            pmVar2 = h->b;
            while( true ) {
              uVar11 = (uint)uVar9;
              uVar3 = uVar9 >> 4;
              uVar8 = pmVar2[uVar3];
              sVar6 = (sbyte)(uVar11 & 0xf);
              if ((((uVar8 >> (uVar11 & 0xf) & 1) != 0) &&
                  (local_48 = h->p[uVar9], uVar1 == (local_48->key).id_len)) &&
                 (iVar5 = bcmp(key,(local_48->key).id,(ulong)uVar1), iVar5 == 0)) {
                if (uVar11 != uVar7) {
                  pmVar2[uVar3] = uVar8 & ~(1 << sVar6);
                  h->size = h->size - 1;
                  if (((pmVar2[uVar3] >> sVar6) >> 0x10 & 1) == 0) {
                    h->n_dirty = h->n_dirty - 1;
                  }
                  if (h->resize_position != 0) {
                    mh_assoc_del_resize(h,uVar11,(void *)0x0);
                  }
                  goto LAB_00110f01;
                }
                break;
              }
              if (((uVar8 >> sVar6) >> 0x10 & 1) == 0) break;
              uVar11 = uVar11 + uVar4 % (uVar7 - 1) + 1;
              uVar8 = uVar7;
              if (uVar11 < uVar7) {
                uVar8 = 0;
              }
              uVar9 = (ulong)(uVar11 - uVar8);
            }
            local_48 = (assoc_val *)0x0;
LAB_00110f01:
            tnt_mem_free((void *)*ptr);
            tnt_mem_free(ptr);
            if (local_40 != (assoc_val *)0x0) {
              tnt_mem_free(local_40);
            }
            if (local_48 != (assoc_val *)0x0) {
              tnt_mem_free(local_48);
            }
            uVar1 = h->n_buckets;
            if (uVar10 < uVar1) {
              do {
                if (uVar1 - 1 == uVar10) goto LAB_00110ff0;
                uVar10 = uVar10 + 1;
              } while ((h->b[uVar10 >> 4] >> (uVar10 & 0xf) & 1) == 0);
            }
          } while (uVar10 < uVar1);
        }
      }
      else {
        uVar10 = 0;
        do {
          if ((h->b[uVar10 >> 4] >> (uVar10 & 0xf) & 1) != 0) goto LAB_00110d54;
          uVar10 = uVar10 + 1;
        } while (uVar1 != uVar10);
      }
LAB_00110ff0:
      mh_assoc_delete(val->index);
    }
  }
  tnt_mem_free(val);
  return;
}

Assistant:

static inline void
tnt_schema_sval_free(struct tnt_schema_sval *val) {
	if (val) {
		tnt_mem_free(val->name);
		if (val->index) {
			tnt_schema_index_free(val->index);
			mh_assoc_delete(val->index);
		}
	}
	tnt_mem_free(val);
}